

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_etc.c
# Opt level: O0

void ppMinPoly(word *b,word *a,size_t l,void *stack)

{
  long lVar1;
  word *r_00;
  word *a_00;
  word *a_01;
  word *a_02;
  word *a_03;
  word *a_04;
  word *pwVar2;
  word *b_00;
  size_t sVar3;
  word wVar4;
  word *in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t nda;
  size_t nq;
  word *db;
  word *da;
  word *r;
  word *q;
  word *bb;
  word *aa;
  size_t nb;
  size_t na;
  size_t m;
  size_t n;
  word *in_stack_ffffffffffffff78;
  word *in_stack_ffffffffffffff80;
  size_t local_78;
  word *stack_00;
  
  r_00 = (word *)(in_RDX + 0x3f >> 6);
  a_00 = (word *)(in_RDX + 0x40 >> 6);
  a_01 = in_RCX + (long)r_00 * 2;
  a_02 = a_01 + (long)r_00 * 2 + 1;
  lVar1 = (long)r_00 + 2;
  a_03 = a_02 + lVar1 + (long)r_00 * 2;
  a_04 = a_03 + (long)a_00;
  stack_00 = a_04 + (long)a_00 + (long)r_00 + 2U;
  wwCopy(in_RCX,in_RSI,(long)r_00 << 1);
  wwTrimHi(in_RCX,(long)r_00 << 1,in_RDX << 1);
  pwVar2 = (word *)wwWordSize(in_RCX,(long)r_00 << 1);
  b_00 = (word *)(in_RDX * 2 + 0x40 >> 6);
  wwSetZero(a_01,(size_t)b_00);
  wwSetBit(a_01,in_RDX << 1,1);
  wwSetW(a_03,(size_t)a_00,1);
  wwSetZero(a_04,(size_t)a_00);
  while( true ) {
    sVar3 = ppDeg(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78 = stack_00;
    if (sVar3 + 1 <= in_RDX) break;
    stack_00 = in_stack_ffffffffffffff78;
    ppDiv(in_stack_ffffffffffffff78,r_00,a_00,(size_t)pwVar2,b_00,(size_t)in_RCX,in_RSI);
    local_78 = wwWordSize(a_02,(long)b_00 + (1 - (long)pwVar2));
    in_stack_ffffffffffffff80 = (word *)wwWordSize(a_03,(size_t)a_00);
    b_00 = pwVar2;
    while (sVar3 = local_78 - 1, local_78 != 0) {
      wVar4 = ppAddMulW(a_04 + sVar3,a_03,(size_t)in_stack_ffffffffffffff80,a_02[sVar3],stack_00);
      a_04[sVar3 + (long)in_stack_ffffffffffffff80] =
           wVar4 ^ a_04[sVar3 + (long)in_stack_ffffffffffffff80];
      local_78 = sVar3;
    }
    wwSwap(a_03,a_04,(size_t)a_00);
    wwCopy(a_01,in_RCX,(size_t)b_00);
    pwVar2 = b_00;
    wwCopy(in_RCX,a_02 + lVar1,(size_t)b_00);
    pwVar2 = (word *)wwWordSize(in_RCX,(size_t)pwVar2);
  }
  wwCopy(in_RDI,a_03,(size_t)a_00);
  return;
}

Assistant:

void ppMinPoly(word b[], const word a[], size_t l, void* stack)
{
	const size_t n = W_OF_B(l);
	const size_t m = W_OF_B(l + 1);
	size_t na, nb;
	// переменные в stack
	word* aa = (word*)stack;
	word* bb = aa + 2 * n;
	word* q = bb + 2 * n + 1;
	word* r = q + n + 2;
	word* da = r + 2 * n;
	word* db = da + m;
	stack = db + m + n + 2;
	// pre
	ASSERT(wwIsValid(b, m) && wwIsValid(a, 2 * n));
	// aa <- a
	wwCopy(aa, a, 2 * n);
	wwTrimHi(aa, 2 * n, 2 * l);
	na = wwWordSize(aa, 2 * n);
	// bb <- x^{2l}
	nb = W_OF_B(2 * l + 1);
	wwSetZero(bb, nb);
	wwSetBit(bb, 2 * l, 1);
	// da <- 1
	wwSetW(da, m, 1);
	// db <- 0
	wwSetZero(db, m);
	// пока deg(aa) >= len
	while (ppDeg(aa, na) + 1 > l)
	{
		size_t nq, nda;
		// (q, r) <- (bb div aa, bb mod aa)
		ppDiv(q, r, bb, nb, aa, na, stack);
		// db <- db + q * da
		nq = wwWordSize(q, nb - na + 1);
		nda = wwWordSize(da, m);
		while (nq--)
			db[nq + nda] ^= ppAddMulW(db + nq, da, nda, q[nq], stack);
		ASSERT(nq + nda <= m || wwIsZero(db, nq + nda - m));
		// da <-> db
		wwSwap(da, db, m);
		// bb <- aa
		wwCopy(bb, aa, na);
		nb = na;
		// aa <- r
		wwCopy(aa, r, na);
		na = wwWordSize(aa, na);
	}
	// b <- da
	wwCopy(b, da, m);
}